

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall
SQCompilation::CheckerVisitor::checkDuplicateSwitchCases
          (CheckerVisitor *this,SwitchStatement *swtch)

{
  bool bVar1;
  size_type_conflict sVar2;
  ArenaVector<SQCompilation::SwitchCase> *this_00;
  SwitchCase *this_01;
  Node *lhs;
  SwitchStatement *in_RSI;
  CheckerVisitor *in_RDI;
  SwitchCase *jcase;
  SwitchCase *icase;
  int32_t j;
  int32_t i;
  ArenaVector<SQCompilation::SwitchCase> *cases;
  uint local_20;
  size_type_conflict local_1c;
  
  if ((in_RDI->effectsOnly & 1U) == 0) {
    this_00 = SwitchStatement::cases(in_RSI);
    for (local_1c = 0; sVar2 = ArenaVector<SQCompilation::SwitchCase>::size(this_00),
        local_20 = local_1c, (int)local_1c < (int)(sVar2 - 1); local_1c = local_1c + 1) {
      while( true ) {
        local_20 = local_20 + 1;
        sVar2 = ArenaVector<SQCompilation::SwitchCase>::size(this_00);
        if (sVar2 <= local_20) break;
        this_01 = ArenaVector<SQCompilation::SwitchCase>::operator[](this_00,local_1c);
        lhs = (Node *)ArenaVector<SQCompilation::SwitchCase>::operator[](this_00,local_20);
        bVar1 = NodeEqualChecker::check((NodeEqualChecker *)this_01,lhs,(Node *)in_RDI);
        if (bVar1) {
          report(in_RDI,(Node *)(lhs->super_ArenaObj)._vptr_ArenaObj,0x42);
        }
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkDuplicateSwitchCases(SwitchStatement *swtch) {

  if (effectsOnly)
    return;

  const auto &cases = swtch->cases();

  for (int32_t i = 0; i < int32_t(cases.size()) - 1; ++i) {
    for (int32_t j = i + 1; j < cases.size(); ++j) {
      const auto &icase = cases[i];
      const auto &jcase = cases[j];

      if (_equalChecker.check(icase.val, jcase.val)) {
        report(jcase.val, DiagnosticsId::DI_DUPLICATE_CASE);
      }
    }
  }
}